

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O1

void verify_accuracy_all<float,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                rng)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  char *__s;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  float fVar7;
  initializer_list<distribution<float>_> __l;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> dists;
  undefined8 auStack_aa8 [313];
  allocator_type local_d9;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_d8;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_c0;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_a8;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_90;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_78;
  vector<distribution<float>,_std::allocator<distribution<float>_>_> local_60;
  distribution<float> local_48;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar6 = 0;
  local_28 = 10;
  uStack_20 = 0x3f800000;
  local_48.deviation = 1.0;
  local_48._20_4_ = 0;
  uStack_30 = 20000000;
  local_48.terms = 20000000;
  local_48.mean = 0;
  __l._M_len = 2;
  __l._M_array = &local_48;
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_d8,__l,&local_d9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"testing for ",0xc);
  __s = _Init + (*_Init == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"kahan:    ",10);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_60,&local_d8);
  puVar4 = (undefined8 *)&stack0x00000008;
  puVar5 = auStack_aa8;
  for (lVar3 = 0x139; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  fVar7 = verify_accuracy<float,sumlib::kahan,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_60);
  poVar2 = std::ostream::_M_insert<double>((double)fVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_60.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"neumaier: ",10);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_78,&local_d8);
  puVar4 = (undefined8 *)&stack0x00000008;
  puVar5 = auStack_aa8;
  for (lVar3 = 0x139; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  fVar7 = verify_accuracy<float,sumlib::neumaier,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_78);
  poVar2 = std::ostream::_M_insert<double>((double)fVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_78.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"naive:    ",10);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_90,&local_d8);
  puVar4 = (undefined8 *)&stack0x00000008;
  puVar5 = auStack_aa8;
  for (lVar3 = 0x139; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  fVar7 = verify_accuracy<float,sumlib::naive,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_90);
  poVar2 = std::ostream::_M_insert<double>((double)fVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_90.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sorted:   ",10);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_a8,&local_d8);
  puVar4 = (undefined8 *)&stack0x00000008;
  puVar5 = auStack_aa8;
  for (lVar3 = 0x139; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  fVar7 = verify_accuracy<float,sumlib::sorted,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_a8);
  poVar2 = std::ostream::_M_insert<double>((double)fVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_a8.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rsorted:  ",10);
  std::vector<distribution<float>,_std::allocator<distribution<float>_>_>::vector
            (&local_c0,&local_d8);
  puVar4 = (undefined8 *)&stack0x00000008;
  puVar5 = auStack_aa8;
  for (lVar3 = 0x139; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  fVar7 = verify_accuracy<float,sumlib::rsorted,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    (&local_c0);
  poVar2 = std::ostream::_M_insert<double>((double)fVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_c0.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  if (local_d8.super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<distribution<float>,_std::allocator<distribution<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void verify_accuracy_all( RNG rng ) {
    const vector<distribution<T>> dists = {
        {20*1000*1000, 0, 1},
        {20*1000*1000, 10, 1},
    };

    cout << "testing for " << typeid(T).name() << ":" << endl;
    cout << "kahan:    " << verify_accuracy<T, kahan>   ( dists, rng ) << endl;
    cout << "neumaier: " << verify_accuracy<T, neumaier>( dists, rng ) << endl;
    cout << "naive:    " << verify_accuracy<T, naive>   ( dists, rng ) << endl;
    cout << "sorted:   " << verify_accuracy<T, sorted>  ( dists, rng ) << endl;
    cout << "rsorted:  " << verify_accuracy<T, rsorted> ( dists, rng ) << endl;

    cout << endl;
}